

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_newarray(HSQUIRRELVM v,SQInteger size)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr local_18;
  
  local_18.super_SQObject._unVal.pArray = SQArray::Create(v->_sharedstate,size);
  local_18.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  SQVM::Push(v,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void sq_newarray(HSQUIRRELVM v,SQInteger size)
{
    v->Push(SQArray::Create(_ss(v), size));
}